

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftpproto.c
# Opt level: O3

void do_pass(session_t *sess)

{
  int iVar1;
  passwd *ppVar2;
  long lVar3;
  char *pcVar4;
  session_t *sess_00;
  
  ppVar2 = getpwuid(sess->uid);
  if (ppVar2 == (passwd *)0x0) {
LAB_001048d4:
    pcVar4 = "Login incorrect.";
  }
  else {
    lVar3 = getspnam(ppVar2->pw_name);
    if (lVar3 == 0) goto LAB_001048d4;
    pcVar4 = crypt(sess->cmd_arg,*(char **)(lVar3 + 8));
    iVar1 = strcmp(pcVar4,*(char **)(lVar3 + 8));
    if (iVar1 == 0) {
      sess_00 = (session_t *)(ulong)ppVar2->pw_gid;
      iVar1 = setegid(ppVar2->pw_gid);
      if (iVar1 < 0) {
        do_pass_cold_2();
LAB_0010494d:
        do_pass_cold_1();
        iVar1 = chdir(sess_00->cmd_arg);
        if (-1 < iVar1) {
          ftp_relply(sess_00,0xfa,"Directory successfully changed.");
          return;
        }
        ftp_relply(sess_00,0x226,"Directory changed fail.");
        return;
      }
      sess_00 = (session_t *)(ulong)ppVar2->pw_uid;
      iVar1 = seteuid(ppVar2->pw_uid);
      if (iVar1 < 0) goto LAB_0010494d;
      signal(0x17,handle_sigurg);
      activate_sigurg(sess->ctrl_fd);
      umask(tunable_local_umask);
      chdir(ppVar2->pw_dir);
      pcVar4 = "Login successful.";
      iVar1 = 0xe6;
      goto LAB_001048e3;
    }
    pcVar4 = "Password incorrect.";
  }
  iVar1 = 0x212;
LAB_001048e3:
  ftp_relply(sess,iVar1,pcVar4);
  return;
}

Assistant:

static void do_pass(session_t *sess) {
  struct passwd *pw = getpwuid(sess->uid);
  if (pw == NULL) {
    ftp_relply(sess, FTP_LOGINERR, "Login incorrect.");
    return;
  }
  // only root can do this
  struct spwd *sp = getspnam(pw->pw_name);
  if (sp == NULL) {
    ftp_relply(sess, FTP_LOGINERR, "Login incorrect.");
    return;
  }

  // encrypt the sess passwd
  char *encrypt_pass = crypt(sess->cmd_arg, sp->sp_pwdp);
  if (strcmp(encrypt_pass, sp->sp_pwdp) != 0) {
    ftp_relply(sess, FTP_LOGINERR, "Password incorrect.");
    return;
  }
  // login successful,set process egid and euid
  if (setegid(pw->pw_gid) < 0) {
    ERR_EXIT("setegid");
  }

  if (seteuid(pw->pw_uid) < 0) {
    ERR_EXIT("seteuid");
  }

  signal(SIGURG, handle_sigurg);
  activate_sigurg(sess->ctrl_fd);

  umask(tunable_local_umask);

  chdir(pw->pw_dir);
  ftp_relply(sess, FTP_LOGINOK, "Login successful.");
}